

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge.hpp
# Opt level: O0

void __thiscall
diy::RegularMergePartners::outgoing
          (RegularMergePartners *this,int round,int gid,vector<int,_std::allocator<int>_> *partners,
          Master *param_5)

{
  value_type_conflict *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  int in_stack_00000018;
  int in_stack_0000001c;
  RegularPartners *in_stack_00000020;
  vector<int,_std::allocator<int>_> tmp;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> local_38 [2];
  
  this_00 = local_38;
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)0x1f1ae4);
  RegularPartners::fill(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000010);
  Catch::clara::std::vector<int,_std::allocator<int>_>::operator[](local_38,0);
  Catch::clara::std::vector<int,_std::allocator<int>_>::push_back(this_00,in_RDI);
  Catch::clara::std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return;
}

Assistant:

inline void   outgoing(int round, int gid, std::vector<int>& partners, const Master&) const    { std::vector<int> tmp; Parent::fill(round, gid, tmp); partners.push_back(tmp[0]); }